

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::abortRead(BlockedPumpFrom *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  AsyncPipe *this_00;
  undefined1 auVar3 [8];
  long *plVar4;
  long lVar5;
  Own<kj::_::ImmediateBrokenPromiseNode> OVar6;
  StringPtr cancelReason;
  undefined1 local_308 [8];
  undefined8 uStack_300;
  BlockedPumpFrom *local_2f8;
  Runnable local_2f0;
  undefined1 *local_2e8;
  BlockedPumpFrom **local_2e0;
  char local_2d8;
  Exception local_2d0;
  NullableValue<kj::Exception> local_178;
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  local_2e0 = &local_2f8;
  local_308 = (undefined1  [8])0x0;
  uStack_300 = (long *)0x0;
  local_2f0._vptr_Runnable = (_func_int **)&PTR_run_0044b4c8;
  local_2f8 = this;
  local_2e8 = local_308;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_178,&local_2f0);
  local_2d8 = local_178.isSet;
  plVar4 = uStack_300;
  if (local_178.isSet != false) {
    local_2d0.ownFile.content.ptr = local_178.field_1.value.ownFile.content.ptr;
    local_2d0.ownFile.content.size_ = local_178.field_1.value.ownFile.content.size_;
    local_2d0.ownFile.content.disposer = local_178.field_1.value.ownFile.content.disposer;
    local_178.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_178.field_1.value.ownFile.content.size_ = 0;
    local_2d0.file = local_178.field_1.value.file;
    local_2d0.line = local_178.field_1.value.line;
    local_2d0.type = local_178.field_1.value.type;
    local_2d0.description.content.ptr = local_178.field_1.value.description.content.ptr;
    local_2d0.description.content.size_ = local_178.field_1.value.description.content.size_;
    local_178.field_1.value.description.content.ptr = (char *)0x0;
    local_178.field_1.value.description.content.size_ = 0;
    local_2d0.description.content.disposer = local_178.field_1.value.description.content.disposer;
    local_2d0.context.ptr.disposer = local_178.field_1.value.context.ptr.disposer;
    local_2d0.context.ptr.ptr = local_178.field_1.value.context.ptr.ptr;
    local_178.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2d0.trace,(void *)((long)&local_178.field_1 + 0x50),0x104);
    Exception::~Exception(&local_178.field_1.value);
    OVar6 = heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_178,&local_2d0);
    auVar3 = local_308;
    local_308._4_4_ = local_178._4_4_;
    local_308._0_4_ = local_178._0_4_;
    plVar4 = (long *)local_178.field_1.value.ownFile.content.ptr;
    if (uStack_300 != (long *)0x0) {
      lVar5 = (long)uStack_300 + *(long *)(*uStack_300 + -0x10);
      uStack_300 = (long *)local_178.field_1.value.ownFile.content.ptr;
      (*(code *)**(undefined8 **)auVar3)(auVar3,lVar5,OVar6.ptr);
      plVar4 = uStack_300;
    }
  }
  uStack_300 = plVar4;
  if (local_2d8 == '\x01') {
    Exception::~Exception(&local_2d0);
  }
  pDVar1 = (this->checkEofTask).super_PromiseBase.node.disposer;
  pPVar2 = (this->checkEofTask).super_PromiseBase.node.ptr;
  *(undefined4 *)&(this->checkEofTask).super_PromiseBase.node.disposer = local_308._0_4_;
  *(undefined4 *)((long)&(this->checkEofTask).super_PromiseBase.node.disposer + 4) = local_308._4_4_
  ;
  *(undefined4 *)&(this->checkEofTask).super_PromiseBase.node.ptr = (undefined4)uStack_300;
  *(undefined4 *)((long)&(this->checkEofTask).super_PromiseBase.node.ptr + 4) = uStack_300._4_4_;
  uStack_300 = (long *)0x0;
  if (pPVar2 != (PromiseNode *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    plVar4 = uStack_300;
    if (uStack_300 != (long *)0x0) {
      uStack_300 = (long *)0x0;
      (*(code *)**(undefined8 **)local_308)(local_308,(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
  }
  this_00 = this->pipe;
  if ((BlockedPumpFrom *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncIoStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");

      // The input might have reached EOF, but we haven't detected it yet because we haven't tried
      // to read that far. If we had not optimized tryPumpFrom() and instead used the default
      // pumpTo() implementation, then the input would not have called write() again once it
      // reached EOF, and therefore the abortRead() on the other end would *not* propagate an
      // exception! We need the same behavior here. To that end, we need to detect if we're at EOF
      // by reading one last byte.
      checkEofTask = kj::evalNow([&]() {
        static char junk;
        return input.tryRead(&junk, 1, 1).then([this](uint64_t n) {
          if (n == 0) {
            fulfiller.fulfill(kj::cp(pumpedSoFar));
          } else {
            fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
          }
        }).eagerlyEvaluate([this](kj::Exception&& e) {
          fulfiller.reject(kj::mv(e));
        });
      });

      pipe.endState(*this);
      pipe.abortRead();
    }